

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O3

void __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::NLConstraint>
::ComputeViolations(ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::NLConstraint>
                    *this,SolCheck *chk)

{
  int *piVar1;
  char cVar2;
  _Map_pointer ppCVar3;
  _Elt_pointer pCVar4;
  int iVar5;
  long lVar6;
  char *pcVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  Container *pCVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  double dVar17;
  ulong extraout_XMM0_Qb;
  double dVar18;
  double dVar19;
  Violation VVar20;
  allocator<char> local_81;
  mapped_type *local_80;
  double local_78;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::array<mp::ViolSummary,_3UL>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::array<mp::ViolSummary,_3UL>_>_>_>
  *local_70;
  key_type local_68;
  double local_48;
  ulong uStack_40;
  
  ppCVar3 = (this->cons_).
            super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::NLConstraint>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::NLConstraint>::Container>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  lVar6 = ((long)(this->cons_).
                 super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::NLConstraint>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::NLConstraint>::Container>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_last -
           (long)(this->cons_).
                 super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::NLConstraint>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::NLConstraint>::Container>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur >> 5) * 0x6db6db6db6db6db7 +
          ((long)(this->cons_).
                 super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::NLConstraint>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::NLConstraint>::Container>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur -
           (long)(this->cons_).
                 super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::NLConstraint>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::NLConstraint>::Container>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_first >> 5) * 0x6db6db6db6db6db7 +
          (((long)ppCVar3 -
            (long)(this->cons_).
                  super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::NLConstraint>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::NLConstraint>::Container>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
          (ulong)(ppCVar3 == (_Map_pointer)0x0)) * 2;
  if ((lVar6 != 0) && (iVar5 = (int)lVar6, iVar5 != 0)) {
    local_70 = &chk->viol_cons_alg_;
    lVar16 = (long)iVar5;
    local_80 = (mapped_type *)0x0;
    lVar6 = lVar16 * 0xe0;
    do {
      lVar16 = lVar16 + -1;
      pCVar4 = (this->cons_).
               super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::NLConstraint>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::NLConstraint>::Container>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur;
      ppCVar3 = (this->cons_).
                super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::NLConstraint>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::NLConstraint>::Container>_>
                ._M_impl.super__Deque_impl_data._M_start._M_node;
      lVar8 = ((long)pCVar4 -
               (long)(this->cons_).
                     super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::NLConstraint>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::NLConstraint>::Container>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_first >> 5) * 0x6db6db6db6db6db7;
      uVar10 = lVar16 + lVar8;
      uVar9 = (uint)uVar10;
      uVar11 = (long)uVar10 >> 1;
      if ((long)uVar10 < 0) {
        lVar14 = *(long *)((long)ppCVar3 + (uVar10 & 0xfffffffffffffffe) * 4);
        if (*(char *)(lVar14 + 0xd9 + (ulong)(uVar9 & 1) * 0xe0) == '\0') {
          cVar2 = *(char *)(lVar14 + 0xd8 + (ulong)(uVar9 & 1) * 0xe0);
          uVar15 = uVar11;
LAB_002abf05:
          pCVar12 = ppCVar3[uVar15] + lVar8 + uVar15 * -2 + lVar16;
LAB_002abf1c:
          uVar13 = (uint)(cVar2 == '\0') << 3;
          uVar9 = uVar13 | 2;
          if (pCVar12->depth_ != 0) {
            uVar9 = uVar13;
          }
          if (uVar9 == 0) {
            uVar9 = 4;
          }
          if ((chk->check_mode_ & uVar9) != 0) {
            if ((long)uVar10 < 0) {
LAB_002abf5a:
              pCVar12 = ppCVar3[uVar11] + lVar8 + uVar11 * -2 + lVar16;
            }
            else {
              if (1 < uVar10) {
                uVar11 = uVar10 >> 1;
                goto LAB_002abf5a;
              }
              pCVar12 = (Container *)
                        ((long)&pCVar4[-1].con_.con_flat_.lcr_.super_LinTerms.coefs_.
                                super_small_vector_base<std::allocator<double>,_6U> + lVar6 + -0x40)
              ;
            }
            VVar20 = NLConstraint::
                     ComputeViolation<mp::VarInfoImpl<std::vector<double,std::allocator<double>>>>
                               ((NLConstraint *)pCVar12,&chk->x_,false);
            dVar18 = VVar20.valX_;
            dVar17 = VVar20.viol_;
            if (chk->feastol_ <= dVar17 && dVar17 != chk->feastol_) {
              dVar19 = 0.0;
              uVar10 = 0;
              if ((dVar18 != 0.0) || (NAN(dVar18))) {
                dVar19 = ABS(dVar17 / dVar18);
                uVar10 = extraout_XMM0_Qb & 0x7fffffffffffffff;
                if (dVar19 < chk->feastolrel_ || dVar19 == chk->feastolrel_) goto LAB_002ac0bb;
              }
              if (local_80 == (mapped_type *)0x0) {
                local_78 = dVar17;
                local_48 = dVar19;
                uStack_40 = uVar10;
                pcVar7 = BasicConstraintKeeper::GetShortTypeName(&this->super_BasicConstraintKeeper)
                ;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_68,pcVar7,&local_81);
                local_80 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::array<mp::ViolSummary,_3UL>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::array<mp::ViolSummary,_3UL>_>_>_>
                           ::operator[](local_70,&local_68);
                dVar17 = local_78;
                dVar19 = local_48;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p != &local_68.field_2) {
                  operator_delete(local_68._M_dataplus._M_p,
                                  local_68.field_2._M_allocated_capacity + 1);
                  dVar17 = local_78;
                  dVar19 = local_48;
                }
              }
              lVar8 = 2 - (ulong)((uVar9 & 0xfffffff8) == 0);
              if ((uVar9 & 2) != 0) {
                lVar8 = 0;
              }
              pCVar4 = (this->cons_).
                       super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::NLConstraint>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::NLConstraint>::Container>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_cur;
              lVar14 = ((long)pCVar4 -
                        (long)(this->cons_).
                              super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::NLConstraint>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::NLConstraint>::Container>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_first >> 5) *
                       0x6db6db6db6db6db7;
              uVar10 = lVar16 + lVar14;
              if ((long)uVar10 < 0) {
                uVar10 = (long)uVar10 >> 1;
LAB_002ac073:
                pCVar12 = (this->cons_).
                          super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::NLConstraint>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::NLConstraint>::Container>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_node[uVar10] +
                          lVar14 + uVar10 * -2 + lVar16;
              }
              else {
                if (1 < uVar10) {
                  uVar10 = uVar10 >> 1;
                  goto LAB_002ac073;
                }
                pCVar12 = (Container *)
                          ((long)&pCVar4[-1].con_.con_flat_.lcr_.super_LinTerms.coefs_.
                                  super_small_vector_base<std::allocator<double>,_6U> +
                          lVar6 + -0x40);
              }
              piVar1 = &local_80->_M_elems[0].N_ + (lVar8 * 5 & 0xffffffffU) * 2;
              pcVar7 = (pCVar12->con_).con_flat_.super_BasicConstraint.name_._M_dataplus._M_p;
              *piVar1 = *piVar1 + 1;
              if (*(double *)(piVar1 + 2) <= dVar17 && dVar17 != *(double *)(piVar1 + 2)) {
                *(double *)(piVar1 + 2) = dVar17;
                *(char **)(piVar1 + 4) = pcVar7;
              }
              if (*(double *)(piVar1 + 6) <= dVar19 && dVar19 != *(double *)(piVar1 + 6)) {
                *(double *)(piVar1 + 6) = dVar19;
                *(char **)(piVar1 + 8) = pcVar7;
              }
            }
          }
        }
      }
      else if (uVar10 < 2) {
        if ((&pCVar4[-1].is_unused_)[lVar6] == '\0') {
          pCVar12 = (Container *)
                    ((long)&pCVar4[-1].con_.con_flat_.lcr_.super_LinTerms.coefs_.
                            super_small_vector_base<std::allocator<double>,_6U> + lVar6 + -0x40);
          cVar2 = (&pCVar4[-1].is_bridged_)[lVar6];
          goto LAB_002abf1c;
        }
      }
      else {
        lVar14 = *(long *)((long)ppCVar3 + (uVar10 & 0xfffffffffffffffe) * 4);
        if (*(char *)(lVar14 + 0xd9 + (ulong)(uVar9 & 1) * 0xe0) == '\0') {
          cVar2 = *(char *)(lVar14 + 0xd8 + (ulong)(uVar9 & 1) * 0xe0);
          uVar15 = uVar10 >> 1;
          goto LAB_002abf05;
        }
      }
LAB_002ac0bb:
      lVar6 = lVar6 + -0xe0;
    } while (lVar16 != 0);
  }
  return;
}

Assistant:

const FlatExprType& GetExpr() const { return con_; }